

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_devices.cpp
# Opt level: O2

void __thiscall
cubeb_stream_get_current_device_Test::TestBody(cubeb_stream_get_current_device_Test *this)

{
  FILE *__stream;
  cubeb_stream *stream_00;
  cubeb *context;
  char *pcVar1;
  Message *pMVar2;
  anon_enum_32 *in_RCX;
  anon_enum_32 *actual;
  int r;
  AssertHelper local_98;
  cubeb_device *device;
  AssertionResult gtest_ar_1;
  cubeb_stream *stream;
  cubeb *ctx;
  cubeb_stream_params local_68;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  
  ctx = (cubeb *)0x0;
  r = common_init(&ctx,"Cubeb audio test");
  local_68._0_8_ = (ulong)local_68.rate << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&r,(int *)&local_68,in_RCX);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    pMVar2 = testing::Message::operator<<
                       ((Message *)&local_68,(char (*) [33])"Error initializing cubeb library");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
               ,0xd8,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    context = ctx;
    __stream = _stdout;
    pcVar1 = cubeb_get_backend_id(ctx);
    fprintf(__stream,"Getting current devices for backend %s\n",pcVar1);
    stream = (cubeb_stream *)0x0;
    local_68.format = CUBEB_SAMPLE_FLOAT32LE;
    local_68.rate = 48000;
    local_68.channels = 1;
    local_68.layout = 4;
    gtest_ar.success_ = true;
    gtest_ar._1_7_ = 0xbb80000000;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000001;
    local_68.prefs = CUBEB_STREAM_PREF_NONE;
    actual = (anon_enum_32 *)0x0;
    r = cubeb_stream_init(ctx,&stream,"Cubeb duplex",(cubeb_devid)0x0,
                          (cubeb_stream_params *)&gtest_ar,(cubeb_devid)0x0,&local_68,0x400,
                          data_cb_duplex,state_cb_duplex,(void *)0x0);
    device._0_4_ = 0;
    testing::internal::EqHelper<false>::Compare<int,__0>
              (&gtest_ar_1.success_,(char *)&r,(int *)&device,actual);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&device);
      pMVar2 = testing::Message::operator<<
                         ((Message *)&device,(char (*) [32])"Error initializing cubeb stream");
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
                 ,0xed,pcVar1);
      testing::internal::AssertHelper::operator=(&local_98,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&device);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      stream_00 = stream;
      r = cubeb_stream_get_current_device(stream,&device);
      if (r == -4) {
        fwrite("Getting current device is not supported for this backend, skipping this test.\n",
               0x4e,1,_stderr);
      }
      else {
        local_98.data_._0_4_ = 0;
        testing::internal::EqHelper<false>::Compare<int,__0>
                  (&gtest_ar_1.success_,(char *)&r,(int *)&local_98,actual);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)&local_98);
          pMVar2 = testing::Message::operator<<
                             ((Message *)&local_98,(char (*) [30])"Error getting current devices");
          if (gtest_ar_1.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
                     ,0xf8,pcVar1);
          testing::internal::AssertHelper::operator=(&local_50,pMVar2);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_98);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_1.message_);
          fprintf(_stdout,"Current output device: %s\n",
                  *(undefined8 *)CONCAT44(device._4_4_,device._0_4_));
          fprintf(_stdout,"Current input device: %s\n",
                  *(undefined8 *)(CONCAT44(device._4_4_,device._0_4_) + 8));
          r = cubeb_stream_device_destroy
                        (stream,(cubeb_device *)CONCAT44(device._4_4_,device._0_4_));
          local_98.data_._0_4_ = 0;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_1.success_,(char *)&r,(int *)&local_98,actual);
          if (gtest_ar_1.success_ == false) {
            testing::Message::Message((Message *)&local_98);
            pMVar2 = testing::Message::operator<<
                               ((Message *)&local_98,
                                (char (*) [33])"Error destroying current devices");
            if (gtest_ar_1.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
                       ,0xfe,pcVar1);
            testing::internal::AssertHelper::operator=(&local_50,pMVar2);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_98);
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_1.message_);
      }
      if (stream_00 != (cubeb_stream *)0x0) {
        cubeb_stream_destroy(stream_00);
      }
    }
    if (context != (cubeb *)0x0) {
      cubeb_destroy(context);
    }
  }
  return;
}

Assistant:

TEST(cubeb, stream_get_current_device)
{
  cubeb * ctx = NULL;
  int r = common_init(&ctx, "Cubeb audio test");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)>
    cleanup_cubeb_at_exit(ctx, cubeb_destroy);

  fprintf(stdout, "Getting current devices for backend %s\n",
    cubeb_get_backend_id(ctx));

  cubeb_stream * stream = NULL;
  cubeb_stream_params input_params;
  cubeb_stream_params output_params;

  input_params.format = output_params.format = CUBEB_SAMPLE_FLOAT32NE;
  input_params.rate = output_params.rate = 48000;
  input_params.channels = output_params.channels = 1;
  input_params.layout = output_params.layout = CUBEB_LAYOUT_MONO;
  input_params.prefs = output_params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "Cubeb duplex",
                        NULL, &input_params, NULL, &output_params,
                        1024, data_cb_duplex, state_cb_duplex, nullptr);
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb stream";
  std::unique_ptr<cubeb_stream, decltype(&cubeb_stream_destroy)>
    cleanup_stream_at_exit(stream, cubeb_stream_destroy);

  cubeb_device * device;
  r = cubeb_stream_get_current_device(stream, &device);
  if (r == CUBEB_ERROR_NOT_SUPPORTED) {
    fprintf(stderr, "Getting current device is not supported"
                    " for this backend, skipping this test.\n");
    return;
  }
  ASSERT_EQ(r, CUBEB_OK) << "Error getting current devices";

  fprintf(stdout, "Current output device: %s\n", device->output_name);
  fprintf(stdout, "Current input device: %s\n", device->input_name);

  r = cubeb_stream_device_destroy(stream, device);
  ASSERT_EQ(r, CUBEB_OK) << "Error destroying current devices";
}